

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall aggreports::LoadReturnPeriods(aggreports *this)

{
  size_t sVar1;
  size_type sVar2;
  value_type_conflict local_1c;
  FILE *pFStack_18;
  int return_period;
  FILE *fin;
  aggreports *this_local;
  
  if ((this->useReturnPeriodFile_ & 1U) != 0) {
    fin = (FILE *)this;
    pFStack_18 = fopen("input/returnperiods.bin","rb");
    if (pFStack_18 == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: Error opening file %s\n","input/returnperiods.bin");
      exit(1);
    }
    while (sVar1 = fread(&local_1c,4,1,pFStack_18), sVar1 == 1) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->returnperiods_,&local_1c);
    }
    fclose(pFStack_18);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
    if (sVar2 == 0) {
      this->useReturnPeriodFile_ = false;
      fprintf(_stderr,
              "WARNING: Empty return periods file. Running without defined return periods option\n")
      ;
    }
  }
  return;
}

Assistant:

void aggreports::LoadReturnPeriods() {

  if (useReturnPeriodFile_ == false) return;

  FILE *fin = fopen(RETURNPERIODS_FILE, "rb");
  if (fin == nullptr) {
    fprintf(stderr, "FATAL: Error opening file %s\n", RETURNPERIODS_FILE);
    exit(EXIT_FAILURE);
  }

  int return_period;
  while (fread(&return_period, sizeof(return_period), 1, fin) == 1) {
    returnperiods_.push_back(return_period);
  }

  fclose(fin);

  if (returnperiods_.size() == 0) {
    useReturnPeriodFile_ = false;
    fprintf(stderr, "WARNING: Empty return periods file. Running without "
		    "defined return periods option\n");
  }

}